

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

string * getTempDir_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_11 [9];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"/tmp/",local_11);
  std::allocator<char>::~allocator(local_11);
  return in_RDI;
}

Assistant:

std::string getTempDir()
{
#if defined(WIN32)
    TCHAR tempPath[MAX_PATH];
    if (GetTempPath(sizeof(tempPath), tempPath))
    {
        std::string thePath = tempPath;
        return thePath;
    }
    return getRootDir() + std::string("TEMP");
#else
    return std::string("/tmp/");
#endif
}